

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_readresp(Curl_easy *data,curl_socket_t sockfd,pingpong *pp,int *ftpcode,size_t *size)

{
  CURLcode CVar1;
  connectdata *conn;
  int code;
  int local_1c;
  
  CVar1 = Curl_pp_readresp(data,sockfd,pp,&local_1c,size);
  (data->info).httpcode = local_1c;
  if (ftpcode != (int *)0x0) {
    *ftpcode = local_1c;
  }
  if (local_1c == 0x1a5) {
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"We got a 421 - timeout");
    }
    (data->conn->proto).ftpc.state = '\0';
    CVar1 = CURLE_OPERATION_TIMEDOUT;
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_readresp(struct Curl_easy *data,
                             curl_socket_t sockfd,
                             struct pingpong *pp,
                             int *ftpcode, /* return the ftp-code if done */
                             size_t *size) /* size of the response */
{
  int code;
  CURLcode result = Curl_pp_readresp(data, sockfd, pp, &code, size);

#ifdef HAVE_GSSAPI
  {
    struct connectdata *conn = data->conn;
    char * const buf = Curl_dyn_ptr(&data->conn->proto.ftpc.pp.recvbuf);

    /* handle the security-oriented responses 6xx ***/
    switch(code) {
    case 631:
      code = Curl_sec_read_msg(data, conn, buf, PROT_SAFE);
      break;
    case 632:
      code = Curl_sec_read_msg(data, conn, buf, PROT_PRIVATE);
      break;
    case 633:
      code = Curl_sec_read_msg(data, conn, buf, PROT_CONFIDENTIAL);
      break;
    default:
      /* normal ftp stuff we pass through! */
      break;
    }
  }
#endif

  /* store the latest code for later retrieval */
  data->info.httpcode = code;

  if(ftpcode)
    *ftpcode = code;

  if(421 == code) {
    /* 421 means "Service not available, closing control connection." and FTP
     * servers use it to signal that idle session timeout has been exceeded.
     * If we ignored the response, it could end up hanging in some cases.
     *
     * This response code can come at any point so having it treated
     * generically is a good idea.
     */
    infof(data, "We got a 421 - timeout");
    ftp_state(data, FTP_STOP);
    return CURLE_OPERATION_TIMEDOUT;
  }

  return result;
}